

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre_regex.cpp
# Opt level: O0

void __thiscall booster::regex::data::data(data *this)

{
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  *(undefined4 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined4 *)(in_RDI + 0x48) = 0;
  return;
}

Assistant:

data() : 
			flags(0),
			re(0),
			are(0),
			re_size(0),
			are_size(0),
			match_size(0) 
		{
		}